

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
::
copy_or_move_from<google::dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>>
          (dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
           *this,dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                 *ht,size_type min_buckets_wanted)

{
  dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
  *a;
  KeyInfo *this_00;
  long lVar1;
  bool bVar2;
  size_type new_num_buckets;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  long lVar6;
  iterator __begin0;
  iterator __end0;
  char *local_78;
  dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
  *local_70;
  pointer local_68;
  dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_60;
  dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_48;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::clear_to_size((dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                   *)this,new_num_buckets);
  local_60.pos = ht->table;
  local_60.end = local_60.pos + ht->num_buckets;
  local_60.ht = ht;
  dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_60);
  local_48.pos = ht->table + ht->num_buckets;
  local_48.ht = ht;
  local_48.end = local_48.pos;
  dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_48);
  if (local_60.pos != local_48.pos) {
    a = this + 0x48;
    this_00 = (KeyInfo *)(this + 0x30);
    local_70 = this;
    do {
      lVar1 = *(long *)(this + 0x60);
      local_68 = local_60.pos;
      pcVar3 = *local_60.pos;
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
      cVar4 = *pcVar3;
      if (cVar4 == '\0') {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          pcVar3 = pcVar3 + 1;
          uVar5 = (long)cVar4 + uVar5 * 0x21;
          cVar4 = *pcVar3;
        } while (cVar4 != '\0');
        uVar5 = uVar5 >> 3;
      }
      uVar5 = uVar5 & lVar1 - 1U;
      local_78 = *(char **)(*(long *)(this + 0x78) + uVar5 * 8);
      bVar2 = KeyInfo::equals<char_const*,char_const*>(this_00,(char **)a,&local_78);
      this = local_70;
      if (!bVar2) {
        lVar6 = 1;
        do {
          uVar5 = uVar5 + lVar6 & lVar1 - 1U;
          local_78 = *(char **)(*(long *)(this + 0x78) + uVar5 * 8);
          bVar2 = KeyInfo::equals<char_const*,char_const*>(this_00,(char **)a,&local_78);
          lVar6 = lVar6 + 1;
        } while (!bVar2);
      }
      *(char **)(*(long *)(this + 0x78) + uVar5 * 8) = *local_68;
      *(long *)(this + 0x58) = *(long *)(this + 0x58) + 1;
      local_60.pos = local_60.pos + 1;
      dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_empty_and_deleted(&local_60);
    } while (local_60.pos != local_48.pos);
  }
  *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }